

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O1

CURLcode Curl_uint_bset_resize(uint_bset *bset,uint nmax)

{
  curl_uint64_t *__dest;
  uint uVar1;
  CURLcode CVar2;
  uint uVar3;
  
  uVar3 = nmax + 0x3f >> 6;
  CVar2 = CURLE_OK;
  if (uVar3 != bset->nslots) {
    __dest = (curl_uint64_t *)(*Curl_ccalloc)(0,8);
    if (__dest == (curl_uint64_t *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      if (bset->slots != (curl_uint64_t *)0x0) {
        uVar1 = bset->nslots;
        if (uVar3 < bset->nslots) {
          uVar1 = uVar3;
        }
        memcpy(__dest,bset->slots,(ulong)(uVar1 << 3));
        (*Curl_cfree)(bset->slots);
      }
      bset->slots = __dest;
      bset->nslots = uVar3;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_uint_bset_resize(struct uint_bset *bset, unsigned int nmax)
{
  unsigned int nslots = (nmax + 63) / 64;

  DEBUGASSERT(bset->init == CURL_UINT_BSET_MAGIC);
  if(nslots != bset->nslots) {
    curl_uint64_t *slots = calloc(nslots, sizeof(curl_uint64_t));
    if(!slots)
      return CURLE_OUT_OF_MEMORY;

    if(bset->slots) {
      memcpy(slots, bset->slots,
             (CURLMIN(nslots, bset->nslots) * sizeof(curl_uint64_t)));
      free(bset->slots);
    }
    bset->slots = slots;
    bset->nslots = nslots;
  }
  return CURLE_OK;
}